

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_equivalentVariableCountReportsCorrectlyAfterUsingRemoveComponent_Test::
~Model_equivalentVariableCountReportsCorrectlyAfterUsingRemoveComponent_Test
          (Model_equivalentVariableCountReportsCorrectlyAfterUsingRemoveComponent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, equivalentVariableCountReportsCorrectlyAfterUsingRemoveComponent)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <component name=\"c1\">\n"
        "    <variable name=\"v1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"c2\">\n"
        "    <variable name=\"v2\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"c1\" component_2=\"c2\">\n"
        "    <map_variables variable_1=\"v1\" variable_2=\"v2\"/>\n"
        "  </connection>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(e);

    model->removeComponent("c1");

    EXPECT_EQ(size_t(0), model->component(0)->variable(0)->equivalentVariableCount());
    EXPECT_EQ(nullptr, model->component(0)->variable(0)->equivalentVariable(0));
}